

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O0

UINTN TianoCompress(void *SrcBuffer,UINT32 SrcSize,void *DstBuffer,UINT32 *DstSize)

{
  UINTN UVar1;
  UINTN Status;
  UINT32 *DstSize_local;
  void *DstBuffer_local;
  UINT32 SrcSize_local;
  void *SrcBuffer_local;
  
  mBufSiz = 0;
  mBuf = (UINT8 *)0x0;
  mText = (UINT8 *)0x0;
  mLevel = (UINT8 *)0x0;
  mChildCount = (UINT8 *)0x0;
  mPosition = (NODE *)0x0;
  mParent = (NODE *)0x0;
  mPrev = (NODE *)0x0;
  mNext = (NODE *)0x0;
  gPBIT = '\x05';
  mSrcUpperLimit = (UINT8 *)((long)SrcBuffer + (ulong)SrcSize);
  mDstUpperLimit = (UINT8 *)((long)DstBuffer + (ulong)*DstSize);
  mSrc = (UINT8 *)SrcBuffer;
  mDst = (UINT8 *)DstBuffer;
  PutDword(0);
  PutDword(0);
  MakeCrcTable();
  mCompSize = 0;
  mOrigSize = 0;
  mCrc = 0;
  UVar1 = Encode();
  if (UVar1 == 0) {
    if (mDst < mDstUpperLimit) {
      *mDst = '\0';
    }
    mDst = (UINT8 *)DstBuffer;
    PutDword(mCompSize + 1);
    PutDword(mOrigSize);
    if (*DstSize < mCompSize + 9) {
      *DstSize = mCompSize + 9;
      SrcBuffer_local = (void *)0x2;
    }
    else {
      *DstSize = mCompSize + 9;
      SrcBuffer_local = (void *)0x0;
    }
  }
  else {
    SrcBuffer_local = (void *)0x3;
  }
  return (UINTN)SrcBuffer_local;
}

Assistant:

EFI_STATUS
TianoCompress(
IN      CONST VOID   *SrcBuffer,
IN      UINT32  SrcSize,
IN      VOID   *DstBuffer,
IN OUT  UINT32  *DstSize
)
/*++

Routine Description:

The main compression routine.

Arguments:

SrcBuffer   - The buffer storing the source data
SrcSize     - The size of source data
DstBuffer   - The buffer to store the compressed data
DstSize     - On input, the size of DstBuffer; On output,
the size of the actual compressed data.

Returns:

EFI_BUFFER_TOO_SMALL  - The DstBuffer is too small. In this case,
DstSize contains the size needed.
EFI_SUCCESS           - Compression is successful.

--*/
{
    EFI_STATUS Status = EFI_SUCCESS;

    //
    // Initializations
    //
    mBufSiz = 0;
    mBuf = NULL;
    mText = NULL;
    mLevel = NULL;
    mChildCount = NULL;
    mPosition = NULL;
    mParent = NULL;
    mPrev = NULL;
    mNext = NULL;
    gPBIT = 5;

    mSrc = (UINT8*)SrcBuffer;
    mSrcUpperLimit = mSrc + SrcSize;
    mDst = DstBuffer;
    mDstUpperLimit = mDst + *DstSize;

    PutDword(0L);
    PutDword(0L);

    MakeCrcTable();

    mOrigSize = mCompSize = 0;
    mCrc = INIT_CRC;

    //
    // Compress it
    //

    Status = Encode();
    if (EFI_ERROR(Status)) {
        return EFI_OUT_OF_RESOURCES;
    }

    //
    // Null terminate the compressed data
    //
    if (mDst < mDstUpperLimit) {
        *mDst++ = 0;
    }

    //
    // Fill in compressed size and original size
    //
    mDst = DstBuffer;
    PutDword(mCompSize + 1);
    PutDword(mOrigSize);

    //
    // Return
    //

    if (mCompSize + 1 + 8 > *DstSize) {
        *DstSize = mCompSize + 1 + 8;
        return EFI_BUFFER_TOO_SMALL;
    }
    else {
        *DstSize = mCompSize + 1 + 8;
        return EFI_SUCCESS;
    }

}